

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

void __thiscall smf::Options::setOptions(Options *this,int argc,char **argv)

{
  char *__s;
  pointer pbVar1;
  char *pcVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  long lVar3;
  
  this->m_processedQ = 0;
  this_00 = &this->m_extraArgv;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(this_00,(long)argc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->m_extraArgv_strings,(long)argc);
  if (0 < argc) {
    lVar3 = 0;
    do {
      __s = *argv;
      pbVar1 = (this->m_extraArgv_strings).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar2 = *(char **)((long)&pbVar1->_M_string_length + lVar3);
      strlen(__s);
      std::__cxx11::string::_M_replace
                ((long)&(pbVar1->_M_dataplus)._M_p + lVar3,0,pcVar2,(ulong)__s);
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&(((this_00->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3));
      argv = argv + 1;
      lVar3 = lVar3 + 0x20;
    } while ((ulong)(uint)argc << 5 != lVar3);
  }
  this->m_oargc =
       (int)((ulong)((long)(this->m_extraArgv).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_extraArgv).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->m_oargv,this_00);
  return;
}

Assistant:

void Options::setOptions(int argc, char** argv) {
   m_processedQ = 0;

   m_extraArgv.resize(argc);
   m_extraArgv_strings.resize(argc);
   int oldsize = 0;

   int i;
   for (i=0; i<argc; i++) {
      m_extraArgv_strings[i+oldsize] = argv[i];
      m_extraArgv[i] = m_extraArgv_strings[i];
   }

   m_oargc  = (int)m_extraArgv.size();
   m_oargv  = m_extraArgv;
}